

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float __thiscall lda::digamma(lda *this,float x)

{
  int iVar1;
  ostream *this_00;
  long in_RDI;
  float local_4;
  
  iVar1 = *(int *)(in_RDI + 0x20);
  if (iVar1 == 0) {
    local_4 = ldamath::digamma<float,(lda_math_mode)0>(0.0);
  }
  else if (iVar1 == 1) {
    local_4 = ldamath::digamma<float,(lda_math_mode)1>(0.0);
  }
  else {
    if (iVar1 != 2) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "lda::digamma: Trampled or invalid math mode, aborting");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_4 = ldamath::digamma<float,(lda_math_mode)2>(0.0);
  }
  return local_4;
}

Assistant:

float lda::digamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::digamma FAST_APPROX ";
      return ldamath::digamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::digamma PRECISE ";
      return ldamath::digamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::digamma SIMD ";
      return ldamath::digamma<float, USE_SIMD>(x);
    default:
      // Should not happen.
      std::cerr << "lda::digamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}